

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall
QMenuPrivate::drawScroller(QMenuPrivate *this,QPainter *painter,Type type,QRect *rect)

{
  bool bVar1;
  QStyleOptionMenuItem *this_00;
  QStyle *pQVar2;
  undefined8 *in_RCX;
  int in_EDX;
  QStyleOption *in_RSI;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QMenu *q;
  QStyleOptionMenuItem menuOpt;
  QRect *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined1 local_a0 [8];
  QFlags<QStyle::StateFlag> local_98 [2];
  undefined8 local_90;
  undefined8 local_88;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_20;
  undefined4 local_1c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_RSI != (QStyleOption *)0x0) &&
       (bVar1 = QRect::isEmpty(in_stack_ffffffffffffff30), !bVar1)) &&
      (in_RDI->scroll != (QMenuScroller *)0x0)) && ((in_RDI->scroll->scrollFlags & 3) != 0)) {
    this_00 = (QStyleOptionMenuItem *)q_func(in_RDI);
    memset(local_a0,0xaa,0x98);
    QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)0x6430ab);
    QStyleOption::initFrom(in_RSI,(QWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffff40));
    QFlags<QStyle::StateFlag>::QFlags
              ((QFlags<QStyle::StateFlag> *)this_00,(StateFlag)((ulong)in_RDI >> 0x20));
    local_5c = 0;
    local_20 = 0;
    local_1c = 0;
    local_90 = *in_RCX;
    local_88 = in_RCX[1];
    local_60 = 4;
    QFlags<QStyle::StateFlag>::operator|=(local_98,State_Enabled);
    if (in_EDX == 1) {
      QFlags<QStyle::StateFlag>::operator|=(local_98,State_DownArrow);
    }
    QPainter::setClipRect((QRect *)in_RSI,(int)local_a0 + 0x10);
    pQVar2 = QWidget::style((QWidget *)in_RDI);
    (**(code **)(*(long *)pQVar2 + 0xb8))(pQVar2,0xf,local_a0,in_RSI,this_00);
    QStyleOptionMenuItem::~QStyleOptionMenuItem(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::drawScroller(QPainter *painter, QMenuPrivate::ScrollerTearOffItem::Type type, const QRect &rect)
{
    if (!painter || rect.isEmpty())
        return;

    if (!scroll || !(scroll->scrollFlags & (QMenuPrivate::QMenuScroller::ScrollUp
                                         | QMenuPrivate::QMenuScroller::ScrollDown)))
        return;

    Q_Q(QMenu);
    QStyleOptionMenuItem menuOpt;
    menuOpt.initFrom(q);
    menuOpt.state = QStyle::State_None;
    menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
    menuOpt.maxIconWidth = 0;
    menuOpt.reservedShortcutWidth = 0;
    menuOpt.rect = rect;
    menuOpt.menuItemType = QStyleOptionMenuItem::Scroller;
    menuOpt.state |= QStyle::State_Enabled;
    if (type == QMenuPrivate::ScrollerTearOffItem::ScrollDown)
        menuOpt.state |= QStyle::State_DownArrow;

    painter->setClipRect(menuOpt.rect);
    q->style()->drawControl(QStyle::CE_MenuScroller, &menuOpt, painter, q);
}